

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

Overlay * __thiscall r_exec::AntiPGMOverlay::reduce_view(AntiPGMOverlay *this,View *input)

{
  bool bVar1;
  MatchResult MVar2;
  uint64_t uVar3;
  AntiPGMOverlay *this_00;
  AntiPGMOverlay *offspring;
  View *pVStack_20;
  uint16_t input_index;
  View *input_local;
  AntiPGMOverlay *this_local;
  
  pVStack_20 = input;
  input_local = (View *)this;
  MVar2 = PGMOverlay::match(&this->super_PGMOverlay,input,(uint16_t *)((long)&offspring + 6));
  if (MVar2 == SUCCESS) {
    uVar3 = r_code::list<unsigned_short>::size(&(this->super_PGMOverlay).input_pattern_indices);
    if (uVar3 == 0) {
      bVar1 = PGMOverlay::check_guards(&this->super_PGMOverlay);
      if (bVar1) {
        AntiPGMController::restart
                  ((AntiPGMController *)
                   (this->super_PGMOverlay).super_InputLessPGMOverlay.super_Overlay.controller);
        this_local = (AntiPGMOverlay *)0x0;
      }
      else {
        Overlay::rollback((Overlay *)this);
        this_local = (AntiPGMOverlay *)0x0;
      }
    }
    else {
      this_00 = (AntiPGMOverlay *)operator_new(0xe8);
      AntiPGMOverlay(this_00,this,offspring._6_2_,
                     (this->super_PGMOverlay).super_InputLessPGMOverlay.super_Overlay.
                     value_commit_index);
      Overlay::commit((Overlay *)this);
      this_local = this_00;
    }
  }
  else {
    if (MVar2 == FAILURE) {
      Overlay::rollback((Overlay *)this);
    }
    this_local = (AntiPGMOverlay *)0x0;
  }
  return (Overlay *)this_local;
}

Assistant:

Overlay *AntiPGMOverlay::reduce_view(r_exec::View *input)
{
    uint16_t input_index;

    switch (match(input, input_index)) {
    case SUCCESS:
        if (input_pattern_indices.size() == 0) { // all patterns matched.
            if (check_guards()) {
                ((AntiPGMController *)controller)->restart();
                return nullptr;
            } else {
                rollback();
                return nullptr;
            }
        } else {
            AntiPGMOverlay *offspring = new AntiPGMOverlay(this, input_index, value_commit_index);
            commit();
            return offspring;
        }

    case FAILURE: // just rollback: let the overlay match other inputs.
        rollback();

    case IMPOSSIBLE:
    default:
        return nullptr;
    }
}